

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O0

pmh_tables<8UL,_frozen::elsa<int>_> * __thiscall
frozen::bits::
make_pmh_tables<8ul,std::pair<int_const,int>,3ul,frozen::elsa<int>,frozen::bits::GetKey,std::equal_to<int>,frozen::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
          (pmh_tables<8UL,_frozen::elsa<int>_> *__return_storage_ptr__,bits *this,
          carray<std::pair<const_int,_int>,_3UL> *items,elsa<int> *hash,equal_to<int> *equal,
          GetKey *key,linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> prg)

{
  value_type_conflict vVar1;
  bucket_t *pbVar2;
  uint64_t uVar3;
  bool bVar4;
  iterator pvVar5;
  bucket_t *pbVar6;
  const_reference pvVar7;
  int *piVar8;
  int *__y;
  iterator pvVar9;
  size_type sVar10;
  value_type_conflict *pvVar11;
  reference pvVar12;
  result_type_conflict rVar13;
  size_type sVar14;
  value_type seed;
  size_t sVar15;
  reference pvVar16;
  reference pvVar17;
  undefined1 local_3a8 [64];
  undefined1 local_368 [64];
  ulong local_328;
  size_t i_1;
  ulong local_318;
  unsigned_long slot;
  cvector<unsigned_long,_4UL> bucket_slots;
  seed_or_index d;
  size_type bsize;
  value_type *bucket_1;
  iterator __end0_1;
  iterator __begin0_1;
  carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *__range2_1;
  carray<unsigned_long,_8UL> H;
  undefined1 local_268 [8];
  carray<frozen::bits::seed_or_index,_8UL> G;
  size_type UNUSED;
  carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> buckets;
  size_t i;
  value_type *bucket;
  iterator __end0;
  iterator __begin0;
  carray<frozen::bits::cvector<unsigned_long,_4UL>,_8UL> *__range2;
  pmh_buckets<8UL> step_one;
  GetKey *key_local;
  equal_to<int> *equal_local;
  elsa<int> *hash_local;
  carray<std::pair<const_int,_int>,_3UL> *items_local;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> prg_local;
  
  step_one.seed = (uint64_t)equal;
  items_local = (carray<std::pair<const_int,_int>,_3UL> *)key;
  make_pmh_buckets<8ul,std::pair<int_const,int>,3ul,frozen::elsa<int>,frozen::bits::GetKey,frozen::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
            ((pmh_buckets<8UL> *)&__range2,this,items,(elsa<int> *)equal,(GetKey *)&items_local,
             (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)key);
  __end0 = carray<frozen::bits::cvector<unsigned_long,_4UL>,_8UL>::begin
                     ((carray<frozen::bits::cvector<unsigned_long,_4UL>,_8UL> *)&__range2);
  pvVar5 = carray<frozen::bits::cvector<unsigned_long,_4UL>,_8UL>::end
                     ((carray<frozen::bits::cvector<unsigned_long,_4UL>,_8UL> *)&__range2);
  do {
    if (__end0 == pvVar5) {
      pmh_buckets<8UL>::get_sorted_buckets
                ((carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *)&UNUSED,
                 (pmh_buckets<8UL> *)&__range2);
      G.data_[7].value_ =
           carray<std::pair<const_int,_int>,_3UL>::size
                     ((carray<std::pair<const_int,_int>,_3UL> *)this);
      seed_or_index::seed_or_index((seed_or_index *)(H.data_ + 7),false,G.data_[7].value_);
      carray<frozen::bits::seed_or_index,_8UL>::carray
                ((carray<frozen::bits::seed_or_index,_8UL> *)local_268,(value_type *)(H.data_ + 7));
      carray<unsigned_long,_8UL>::carray
                ((carray<unsigned_long,_8UL> *)&__range2_1,&G.data_[7].value_);
      __end0_1 = carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL>::begin
                           ((carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *)&UNUSED);
      pvVar9 = carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL>::end
                         ((carray<frozen::bits::pmh_buckets<8UL>::bucket_ref,_8UL> *)&UNUSED);
      for (; __end0_1 != pvVar9; __end0_1 = __end0_1 + 1) {
        sVar10 = pmh_buckets<8UL>::bucket_ref::size(__end0_1);
        if (sVar10 == 1) {
          pvVar11 = pmh_buckets<8UL>::bucket_ref::operator[](__end0_1,0);
          seed_or_index::seed_or_index(&d,false,*pvVar11);
          pvVar12 = carray<frozen::bits::seed_or_index,_8UL>::operator[]
                              ((carray<frozen::bits::seed_or_index,_8UL> *)local_268,
                               (ulong)__end0_1->hash);
          pvVar12->value_ = d.value_;
        }
        else if (1 < sVar10) {
          rVar13 = linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::operator()
                             ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>
                               *)&items_local);
          seed_or_index::seed_or_index((seed_or_index *)&bucket_slots.dsize,true,rVar13);
          cvector<unsigned_long,_4UL>::cvector((cvector<unsigned_long,_4UL> *)&slot);
          while (sVar14 = cvector<unsigned_long,_4UL>::size((cvector<unsigned_long,_4UL> *)&slot),
                uVar3 = step_one.seed, sVar14 < sVar10) {
            sVar14 = cvector<unsigned_long,_4UL>::size((cvector<unsigned_long,_4UL> *)&slot);
            pvVar11 = pmh_buckets<8UL>::bucket_ref::operator[](__end0_1,sVar14);
            pvVar7 = carray<std::pair<const_int,_int>,_3UL>::operator[]
                               ((carray<std::pair<const_int,_int>,_3UL> *)this,*pvVar11);
            piVar8 = GetKey::operator()((GetKey *)uVar3,pvVar7);
            seed = seed_or_index::value((seed_or_index *)&bucket_slots.dsize);
            sVar15 = elsa<int>::operator()((elsa<int> *)items,piVar8,seed);
            local_318 = sVar15 & 7;
            pvVar16 = carray<unsigned_long,_8UL>::operator[]
                                ((carray<unsigned_long,_8UL> *)&__range2_1,local_318);
            if ((*pvVar16 == G.data_[7].value_) &&
               (bVar4 = all_different_from<unsigned_long,4ul>
                                  ((cvector<unsigned_long,_4UL> *)&slot,&local_318), bVar4)) {
              cvector<unsigned_long,_4UL>::push_back
                        ((cvector<unsigned_long,_4UL> *)&slot,&local_318);
            }
            else {
              cvector<unsigned_long,_4UL>::clear((cvector<unsigned_long,_4UL> *)&slot);
              rVar13 = linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
                       operator()((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>
                                   *)&items_local);
              seed_or_index::seed_or_index((seed_or_index *)&i_1,true,rVar13);
              bucket_slots.dsize = i_1;
            }
          }
          pvVar12 = carray<frozen::bits::seed_or_index,_8UL>::operator[]
                              ((carray<frozen::bits::seed_or_index,_8UL> *)local_268,
                               (ulong)__end0_1->hash);
          pvVar12->value_ = bucket_slots.dsize;
          for (local_328 = 0; local_328 < sVar10; local_328 = local_328 + 1) {
            pvVar11 = pmh_buckets<8UL>::bucket_ref::operator[](__end0_1,local_328);
            vVar1 = *pvVar11;
            pvVar17 = cvector<unsigned_long,_4UL>::operator[]
                                ((cvector<unsigned_long,_4UL> *)&slot,local_328);
            pvVar16 = carray<unsigned_long,_8UL>::operator[]
                                ((carray<unsigned_long,_8UL> *)&__range2_1,*pvVar17);
            *pvVar16 = vVar1;
          }
        }
      }
      memcpy(local_368,local_268,0x40);
      memcpy(local_3a8,&__range2_1,0x40);
      pmh_tables<8UL,_frozen::elsa<int>_>::pmh_tables
                (__return_storage_ptr__,step_one.buckets.data_[7].dsize);
      return __return_storage_ptr__;
    }
    for (buckets.data_[7].ptr = (bucket_t *)0x1; pbVar2 = buckets.data_[7].ptr,
        pbVar6 = (bucket_t *)cvector<unsigned_long,_4UL>::size(__end0), uVar3 = step_one.seed,
        pbVar2 < pbVar6; buckets.data_[7].ptr = (bucket_t *)((long)(buckets.data_[7].ptr)->data + 1)
        ) {
      pvVar7 = carray<std::pair<const_int,_int>,_3UL>::operator[]
                         ((carray<std::pair<const_int,_int>,_3UL> *)this,0);
      piVar8 = GetKey::operator()((GetKey *)uVar3,pvVar7);
      uVar3 = step_one.seed;
      pvVar7 = carray<std::pair<const_int,_int>,_3UL>::operator[]
                         ((carray<std::pair<const_int,_int>,_3UL> *)this,
                          (size_t)buckets.data_[7].ptr);
      __y = GetKey::operator()((GetKey *)uVar3,pvVar7);
      bVar4 = std::equal_to<int>::operator()((equal_to<int> *)hash,piVar8,__y);
      if (bVar4) {
        __assert_fail("!equal(key(items[0]), key(items[i])) && \"unique keys\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/include/frozen/bits/pmh.h"
                      ,0xc9,
                      "pmh_tables<M, Hash> frozen::bits::make_pmh_tables(const carray<Item, N> &, const Hash &, const KeyEqual &, const Key &, PRG) [M = 8UL, Item = std::pair<const int, int>, N = 3UL, Hash = frozen::elsa<int>, Key = frozen::bits::GetKey, KeyEqual = std::equal_to<int>, PRG = frozen::linear_congruential_engine<unsigned long, 48271, 0, 2147483647>]"
                     );
      }
    }
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

pmh_tables<M, Hash> constexpr make_pmh_tables(const carray<Item, N> &
                                                               items,
                                                           Hash const &hash,
                                                           KeyEqual const &equal,
                                                           Key const &key,
                                                           PRG prg) {
  // Step 1: Place all of the keys into buckets
  auto step_one = make_pmh_buckets<M>(items, hash, key, prg);

#ifndef NDEBUG
  // Step 1.5: Detect redundant keys.
  for(auto const& bucket : step_one.buckets)
    for(std::size_t i = 1; i < bucket.size(); ++i)
      constexpr_assert(!equal(key(items[0]), key(items[i])), "unique keys");
#endif

  // Step 2: Sort the buckets to process the ones with the most items first.
  auto buckets = step_one.get_sorted_buckets();

  // Special value for unused slots. This is purposefully the index
  // one-past-the-end of 'items' to function as a sentinel value. Both to avoid
  // the need to apply the KeyEqual predicate and to be easily convertible to
  // end().
  // Unused entries in both hash tables (G and H) have to contain this value.
  const auto UNUSED = items.size();

  // G becomes the first hash table in the resulting pmh function
  carray<seed_or_index, M> G({false, UNUSED});

  // H becomes the second hash table in the resulting pmh function
  carray<std::size_t, M> H(UNUSED);

  // Step 3: Map the items in buckets into hash tables.
  for (const auto & bucket : buckets) {
    auto const bsize = bucket.size();

    if (bsize == 1) {
      // Store index to the (single) item in G
      // assert(bucket.hash == hash(key(items[bucket[0]]), step_one.seed) % M);
      G[bucket.hash] = {false, static_cast<std::uint64_t>(bucket[0])};
    } else if (bsize > 1) {

      // Repeatedly try different H of d until we find a hash function
      // that places all items in the bucket into free slots
      seed_or_index d{true, prg()};
      cvector<std::size_t, decltype(step_one)::bucket_max> bucket_slots;

      while (bucket_slots.size() < bsize) {
        auto slot = hash(key(items[bucket[bucket_slots.size()]]), static_cast<std::size_t>(d.value())) % M;

        if (H[slot] != UNUSED || !all_different_from(bucket_slots, slot)) {
          bucket_slots.clear();
          d = {true, prg()};
          continue;
        }

        bucket_slots.push_back(slot);
      }

      // Put successful seed in G, and put indices to items in their slots
      // assert(bucket.hash == hash(key(items[bucket[0]]), step_one.seed) % M);
      G[bucket.hash] = d;
      for (std::size_t i = 0; i < bsize; ++i)
        H[bucket_slots[i]] = bucket[i];
    }
  }

  return {step_one.seed, G, H, hash};
}